

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O1

void __thiscall hwtest::pgraph::anon_unknown_14::MthdSifmFormat::emulate_mthd(MthdSifmFormat *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  
  iVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
          chipset.card_type;
  uVar3 = (uint)(0xf < iVar1) * 8 + 7 & (this->super_SingleMthdTest).super_MthdTest.val;
  uVar5 = 6;
  if (uVar3 != 1) {
    uVar5 = 0;
  }
  uVar4 = 7;
  if (uVar3 != 2) {
    uVar4 = uVar5;
  }
  uVar5 = 0xd;
  if (uVar3 != 3) {
    uVar5 = uVar4;
  }
  uVar4 = 0xe;
  if (uVar3 != 4) {
    uVar4 = uVar5;
  }
  uVar5 = 0x12;
  if (uVar3 != 5) {
    uVar5 = uVar4;
  }
  uVar4 = 0x13;
  if (uVar3 != 6) {
    uVar4 = uVar5;
  }
  uVar5 = 10;
  if (uVar3 != 7) {
    uVar5 = uVar4;
  }
  uVar4 = 1;
  if (uVar3 != 8) {
    uVar4 = uVar5;
  }
  uVar5 = 0x15;
  if (uVar3 != 9) {
    uVar5 = uVar4;
  }
  uVar4 = 0x16;
  if (uVar3 != 10) {
    uVar4 = uVar5;
  }
  uVar6 = 0x17;
  if (uVar3 != 0xb) {
    uVar6 = uVar4;
  }
  iVar2 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
          chipset.chipset;
  if (iVar2 == 0x15) {
    uVar6 = uVar5;
  }
  if (iVar2 < 0x11) {
    uVar6 = uVar5;
  }
  uVar5 = 0x18;
  if (uVar3 != 0xc) {
    uVar5 = uVar6;
  }
  uVar4 = 0x19;
  if (uVar3 != 0xd) {
    uVar4 = uVar5;
  }
  if (iVar1 < 0x30) {
    uVar4 = uVar6;
  }
  pgraph_grobj_set_color_format
            (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
             (this->super_SingleMthdTest).super_MthdTest.egrobj,uVar4);
  return;
}

Assistant:

void emulate_mthd() override {
		int sfmt = val & 7;
		if (chipset.card_type >= 0x10)
			sfmt = val & 0xf;
		int fmt = 0;
		if (sfmt == 1)
			fmt = 0x6;
		if (sfmt == 2)
			fmt = 0x7;
		if (sfmt == 3)
			fmt = 0xd;
		if (sfmt == 4)
			fmt = 0xe;
		if (sfmt == 5)
			fmt = 0x12;
		if (sfmt == 6)
			fmt = 0x13;
		if (sfmt == 7)
			fmt = 0xa;
		if (sfmt == 8)
			fmt = 0x1;
		if (sfmt == 9)
			fmt = 0x15;
		if (nv04_pgraph_is_nv11p(&chipset)) {
			if (sfmt == 0xa)
				fmt = 0x16;
			if (sfmt == 0xb)
				fmt = 0x17;
		}
		if (chipset.card_type >= 0x30) {
			if (sfmt == 0xc)
				fmt = 0x18;
			if (sfmt == 0xd)
				fmt = 0x19;
		}
		pgraph_grobj_set_color_format(&exp, egrobj, fmt);
	}